

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O0

void init_fdtd_2D_medium(fdtd2D *fdtd,init_medium_fun_2D permeability_invR,
                        init_medium_fun_2D permittivity_invR,void *user)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 in_RCX;
  code *in_RDX;
  code *in_RSI;
  double *in_RDI;
  double dVar5;
  uintmax_t j;
  float_type posY;
  uintmax_t i;
  float_type posX;
  float_type_0_ *permeability_inv;
  float_type_0_ *permittivity_inv;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  dVar1 = in_RDI[0x1a];
  dVar2 = in_RDI[6];
  dVar3 = in_RDI[0x1a];
  dVar4 = in_RDI[7];
  local_38 = 0.0;
  for (local_40 = 0.0; (ulong)local_40 < (ulong)in_RDI[0x19];
      local_40 = (double)((long)local_40 + 1)) {
    local_48 = 0.0;
    for (local_50 = 0.0; (ulong)local_50 < (ulong)in_RDI[0x1a];
        local_50 = (double)((long)local_50 + 1)) {
      dVar5 = (double)(*in_RSI)(local_38,local_48,in_RCX);
      *(double *)((long)dVar4 + (long)dVar3 * (long)local_40 * 8 + (long)local_50 * 8) =
           1.0 / (dVar5 * 1.2566370614359173e-06);
      dVar5 = (double)(*in_RDX)(local_38,local_48,in_RCX);
      *(double *)((long)dVar2 + (long)dVar1 * (long)local_40 * 8 + (long)local_50 * 8) =
           1.0 / (dVar5 * 8.85418781762039e-12);
      local_48 = in_RDI[1] + local_48;
    }
    local_38 = *in_RDI + local_38;
  }
  return;
}

Assistant:

void init_fdtd_2D_medium(struct fdtd2D *fdtd,
                         init_medium_fun_2D permeability_invR,
                         init_medium_fun_2D permittivity_invR, void *user) {
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permittivity_inv,
                    fdtd->permittivity_inv);
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permeability_inv,
                    fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      permeability_inv[i][j] =
          float_cst(1.) / (permeability_invR(posX, posY, user) * mu0);
      permittivity_inv[i][j] =
          float_cst(1.) / (permittivity_invR(posX, posY, user) * eps0);
    }
  }
}